

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t rType,uint32_t rId)

{
  char *str;
  Error EVar1;
  ulong uVar2;
  long lVar3;
  StringBuilder *in_RDX;
  StringBuilder *in_RDI;
  uint in_R8D;
  uint in_R9D;
  X86RegFormatInfo *rfi;
  char *name;
  VirtReg *vReg;
  CodeCompiler *cc;
  size_t index;
  size_t index_1;
  char *in_stack_000002e0;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  StringBuilder *in_stack_ffffffffffffff18;
  
  if (0xfffffeff < in_R9D - 0x100) {
    if (in_R8D < 0x20) {
      lVar3 = (ulong)in_R8D * 4;
      if (in_R9D < (byte)x86RegFormatInfo[lVar3 + 3]) {
        EVar1 = StringBuilder::_opString
                          (in_stack_ffffffffffffff18,
                           (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                           in_stack_ffffffffffffff08,(size_t)(x86RegFormatInfo + lVar3));
        return EVar1;
      }
      if (in_R9D < (byte)x86RegFormatInfo[lVar3]) {
        EVar1 = StringBuilder::appendFormat
                          (in_RDI,x86RegFormatStrings + (int)(uint)(byte)x86RegFormatInfo[lVar3 + 1]
                           ,(ulong)in_R9D);
        return EVar1;
      }
    }
    EVar1 = StringBuilder::appendFormat(in_RDI,"PhysReg<Type=%u Id=%u>",(ulong)in_R8D,(ulong)in_R9D)
    ;
    return EVar1;
  }
  if (((in_RDX == (StringBuilder *)0x0) || ((char)in_RDX[1]._length != '\x03')) ||
     (in_RDX[0xd]._canFree <= (ulong)(in_R9D - 0x100))) {
    EVar1 = StringBuilder::appendFormat(in_RDI,"VirtReg<Type=%u Id=%u>",(ulong)in_R8D,(ulong)in_R9D)
    ;
    return EVar1;
  }
  if (in_R9D == 0xffffffff) {
    DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
  }
  uVar2 = (ulong)(in_R9D - 0x100);
  if (uVar2 < in_RDX[0xd]._canFree) {
    if (in_RDX[0xd]._canFree <= uVar2) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    lVar3 = *(long *)(in_RDX[0xd]._capacity + uVar2 * 8);
    if (lVar3 != 0) {
      str = *(char **)(lVar3 + 8);
      if ((str != (char *)0x0) && (*str != '\0')) {
        EVar1 = StringBuilder::_opString
                          (in_RDX,(uint32_t)((ulong)lVar3 >> 0x20),str,in_stack_ffffffffffffff00);
        return EVar1;
      }
      EVar1 = StringBuilder::appendFormat(in_RDI,"v%u",(ulong)(in_R9D - 0x100));
      return EVar1;
    }
    DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
  }
  DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t rType,
  uint32_t rId) noexcept {

  ASMJIT_UNUSED(logOptions);
  ASMJIT_UNUSED(archType);

  if (Operand::isPackedId(rId)) {
#if !defined(ASMJIT_DISABLE_COMPILER)
    if (emitter && emitter->getType() == CodeEmitter::kTypeCompiler) {
      const CodeCompiler* cc = static_cast<const CodeCompiler*>(emitter);

      if (cc->isVirtRegValid(rId)) {
        VirtReg* vReg = cc->getVirtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->getName();
        if (name && name[0] != '\0')
          return sb.appendString(name);
        else
          return sb.appendFormat("v%u", static_cast<unsigned int>(Operand::unpackId(rId)));
      }
    }
#endif // !ASMJIT_DISABLE_COMPILER

    return sb.appendFormat("VirtReg<Type=%u Id=%u>", rType, rId);
  }
  else {
    if (rType < ASMJIT_ARRAY_SIZE(x86RegFormatInfo)) {
      const X86RegFormatInfo& rfi = x86RegFormatInfo[rType];

      if (rId < rfi.specialCount)
        return sb.appendString(x86RegFormatStrings + rfi.specialIndex + rId * 4);

      if (rId < rfi.count)
        return sb.appendFormat(x86RegFormatStrings + rfi.formatIndex, static_cast<unsigned int>(rId));
    }

    return sb.appendFormat("PhysReg<Type=%u Id=%u>", rType, rId);
  }
}